

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Exception::Exception(Exception *this,string *msg)

{
  pointer pcVar1;
  
  *(undefined ***)this = &PTR__Exception_00137b28;
  (this->msg_)._M_dataplus._M_p = (pointer)&(this->msg_).field_2;
  pcVar1 = (msg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->msg_,pcVar1,pcVar1 + msg->_M_string_length);
  return;
}

Assistant:

Exception::Exception(std::string const& msg)
  : msg_(msg)
{}